

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  pthread_mutex_t *__mutex;
  DescriptorPool *pool_00;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  Type *pTVar4;
  Type TVar6;
  Type *pTVar7;
  WrappedMutex *mu;
  Symbol SVar8;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  pointer local_38;
  anon_union_8_8_13f84498_for_Symbol_2 aVar5;
  
  __mutex = (pthread_mutex_t *)pool->mutex_;
  if (__mutex == (pthread_mutex_t *)0x0) {
    mu = (Mutex *)0x0;
LAB_002c4abc:
    internal::MutexLockMaybe::MutexLockMaybe(&local_40,mu);
    if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(this->known_bad_symbols_)._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(this->known_bad_files_)._M_h);
    }
    local_38 = (name->_M_dataplus)._M_p;
    cVar3 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->symbols_by_name_)._M_h,&local_38);
    pTVar4 = (Type *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                            ._M_cur + 0x10);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
        _M_cur == (__node_type *)0x0) {
      pTVar4 = &(anonymous_namespace)::kNullSymbol;
    }
    aVar5 = (anon_union_8_8_13f84498_for_Symbol_2)
            ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar4 + 2))->descriptor;
    TVar6 = *pTVar4;
    if (TVar6 == NULL_SYMBOL) {
      pool_00 = pool->underlay_;
      if (pool_00 != (DescriptorPool *)0x0) {
        SVar8 = FindByNameHelper((pool_00->tables_)._M_t.
                                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                 ._M_head_impl,pool_00,name);
        aVar5 = SVar8.field_1;
        TVar6 = SVar8.type;
        if (TVar6 != NULL_SYMBOL) goto LAB_002c4b1d;
      }
      bVar1 = TryFindSymbolInFallbackDatabase(pool,name);
      TVar6 = NULL_SYMBOL;
      if (bVar1) {
        local_38 = (name->_M_dataplus)._M_p;
        cVar3 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->symbols_by_name_)._M_h,&local_38);
        pTVar4 = (Type *)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                                ._M_cur + 0x10);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
            _M_cur == (__node_type *)0x0) {
          pTVar4 = &(anonymous_namespace)::kNullSymbol;
        }
        aVar5 = (anon_union_8_8_13f84498_for_Symbol_2)
                ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar4 + 2))->descriptor;
        TVar6 = *pTVar4;
      }
    }
LAB_002c4b1d:
    if ((pthread_mutex_t *)local_40.mu_ == (pthread_mutex_t *)0x0) goto LAB_002c4b2c;
  }
  else {
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if ((this->known_bad_files_)._M_h._M_element_count != 0 ||
        (this->known_bad_symbols_)._M_h._M_element_count != 0) {
LAB_002c4aad:
      pthread_mutex_unlock(__mutex);
      mu = pool->mutex_;
      goto LAB_002c4abc;
    }
    local_38 = (name->_M_dataplus)._M_p;
    cVar3 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->symbols_by_name_)._M_h,&local_38);
    pTVar4 = (Type *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                            ._M_cur + 0x10);
    pTVar7 = pTVar4;
    if (cVar3.
        super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
        _M_cur == (__node_type *)0x0) {
      pTVar7 = &(anonymous_namespace)::kNullSymbol;
    }
    TVar6 = *pTVar7;
    if (TVar6 == NULL_SYMBOL) goto LAB_002c4aad;
    if (cVar3.
        super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
        _M_cur == (__node_type *)0x0) {
      pTVar4 = &(anonymous_namespace)::kNullSymbol;
    }
    aVar5 = (anon_union_8_8_13f84498_for_Symbol_2)
            ((anon_union_8_8_13f84498_for_Symbol_2 *)(pTVar4 + 2))->descriptor;
    local_40.mu_ = (Mutex *)__mutex;
  }
  pthread_mutex_unlock((pthread_mutex_t *)local_40.mu_);
LAB_002c4b2c:
  SVar8._4_4_ = 0;
  SVar8.type = TVar6;
  SVar8.field_1.descriptor = aVar5.descriptor;
  return SVar8;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                const std::string& name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}